

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refresh.c
# Opt level: O1

void re_putliteral(EditLine *el,wchar_t *begin,wchar_t *end)

{
  wchar_t wVar1;
  wint_t **ppwVar2;
  wint_t wVar3;
  undefined8 in_RAX;
  long lVar4;
  wchar_t wVar5;
  int iVar6;
  wchar_t w;
  wchar_t local_14;
  
  local_14 = (wchar_t)((ulong)in_RAX >> 0x20);
  wVar1 = (el->el_terminal).t_size.h;
  wVar3 = literal_add(el,begin,end,&local_14);
  if ((wVar3 != 0) && (L'\0' < local_14)) {
    ppwVar2 = el->el_vdisplay;
    ppwVar2[(el->el_refresh).r_cursor.v][(el->el_refresh).r_cursor.h] = wVar3;
    lVar4 = (long)wVar1 - (long)(el->el_refresh).r_cursor.h;
    wVar5 = (wchar_t)lVar4;
    if (local_14 < (wchar_t)lVar4) {
      wVar5 = local_14;
    }
    if (L'\x01' < wVar5) {
      iVar6 = wVar5 + L'\x01';
      if (local_14 < lVar4) {
        lVar4 = (long)local_14;
      }
      do {
        ppwVar2[(el->el_refresh).r_cursor.v][(long)(el->el_refresh).r_cursor.h + lVar4 + -1] =
             0xffffffff;
        iVar6 = iVar6 + -1;
        lVar4 = lVar4 + -1;
      } while (2 < iVar6);
    }
    local_14 = (el->el_refresh).r_cursor.h + local_14;
    (el->el_refresh).r_cursor.h = local_14;
    if (wVar1 <= local_14) {
      ppwVar2[(el->el_refresh).r_cursor.v][wVar1] = 0;
      re_nextline(el);
    }
  }
  return;
}

Assistant:

libedit_private void
re_putliteral(EditLine *el, const wchar_t *begin, const wchar_t *end)
{
	coord_t *cur = &el->el_refresh.r_cursor;
	wint_t c;
	int sizeh = el->el_terminal.t_size.h;
	int i, w;

	c = literal_add(el, begin, end, &w);
	if (c == 0 || w <= 0)
		return;
	el->el_vdisplay[cur->v][cur->h] = c;

	i = w;
	if (i > sizeh - cur->h)		/* avoid overflow */
		i = sizeh - cur->h;
	while (--i > 0)
		el->el_vdisplay[cur->v][cur->h + i] = MB_FILL_CHAR;

	cur->h += w;
	if (cur->h >= sizeh) {
		/* assure end of line */
		el->el_vdisplay[cur->v][sizeh] = '\0';
		re_nextline(el);
	}
}